

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

char * __thiscall Json::ValueIteratorBase::index(ValueIteratorBase *this,char *__s,int __c)

{
  CZString czstring;
  CZString local_20;
  
  Value::CZString::CZString(&local_20,(CZString *)((this->current_)._M_node + 1));
  Value::CZString::~CZString(&local_20);
  return (char *)(ulong)(-(uint)(local_20.cstr_ != (char *)0x0) | local_20.field_1.index_);
}

Assistant:

Reader::Reader()
    : errors_(), document_(), begin_(), end_(), current_(), lastValueEnd_(),
      lastValue_(), commentsBefore_(), features_(Features::all()),
      collectComments_() {}